

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O0

int password_get_info(char *hash,char **algo,int *cost)

{
  size_t sVar1;
  size_t len;
  int *cost_local;
  char **algo_local;
  char *hash_local;
  
  *algo = (char *)0x0;
  *cost = 0;
  if (hash == (char *)0x0) {
    if (-1 < msgno) {
      fprintf(_stderr,"password_get_info: missing hash\n");
    }
    hash_local._4_4_ = -1;
  }
  else {
    if ((0 < msgno) && (-1 < msgno)) {
      fprintf(_stderr,"password_get_info: hash => %s\n",hash);
    }
    sVar1 = strlen(hash);
    if ((((sVar1 < 4) || (sVar1 != 0x3c)) || (*hash != '$')) ||
       ((hash[1] != '2' || (hash[2] != 'y')))) {
      *algo = "unknown";
    }
    else {
      *algo = "bcrypt";
      __isoc99_sscanf(hash,"$2y$%d$",cost);
    }
    hash_local._4_4_ = 0;
  }
  return hash_local._4_4_;
}

Assistant:

int
password_get_info(const char *hash, char **algo, int *cost)
{
    size_t len;

    *algo = NULL;
    *cost = 0;

    if (!hash) {
        msg_error(get_info, "missing hash\n");
        return -1;
    }

    msg_verbose(get_info, "hash => %s\n", hash);

    len = strlen(hash);

    if (len > 3 && len == 60 &&
        hash[0] == '$' && hash[1] == '2' && hash[2] == 'y') {
        *algo = BCRYPT_BLOWFISH;
        sscanf(hash, "$2y$%d$", cost);
    } else {
        *algo = "unknown";
    }

    return 0;
}